

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O0

void term_pwron(Terminal *term,_Bool clear)

{
  _Bool clear_local;
  Terminal *term_local;
  
  power_on(term,clear);
  if (term->ldisc != (Ldisc *)0x0) {
    ldisc_echoedit_update(term->ldisc);
  }
  term->disptop = L'\0';
  deselect(term);
  term_update(term);
  return;
}

Assistant:

void term_pwron(Terminal *term, bool clear)
{
    power_on(term, clear);
    if (term->ldisc)                   /* cause ldisc to notice changes */
        ldisc_echoedit_update(term->ldisc);
    term->disptop = 0;
    deselect(term);
    term_update(term);
}